

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# darScript.c
# Opt level: O1

Aig_Man_t * Dar_ManChoiceNewAig(Aig_Man_t *pAig,Dch_Pars_t *pPars)

{
  uint uVar1;
  uint uVar2;
  void *pvVar3;
  void *pvVar4;
  char *pcVar5;
  int iVar6;
  int iVar7;
  Vec_Ptr_t *pVVar8;
  void **ppvVar9;
  Aig_Man_t *pAVar10;
  Aig_Man_t *p;
  size_t sVar11;
  char *__dest;
  char *__dest_00;
  long lVar12;
  long lVar13;
  timespec ts;
  timespec local_40;
  
  iVar7 = pPars->fVerbose;
  iVar6 = clock_gettime(3,&local_40);
  if (iVar6 < 0) {
    lVar12 = 1;
  }
  else {
    lVar12 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_40.tv_nsec),8);
    lVar12 = ((lVar12 >> 7) - (lVar12 >> 0x3f)) + local_40.tv_sec * -1000000;
  }
  pVVar8 = Dar_ManChoiceSynthesis(pAig,1,1,pPars->fPower,iVar7);
  iVar7 = clock_gettime(3,&local_40);
  if (iVar7 < 0) {
    lVar13 = -1;
  }
  else {
    lVar13 = local_40.tv_nsec / 1000 + local_40.tv_sec * 1000000;
  }
  pPars->timeSynth = lVar13 + lVar12;
  iVar7 = pVVar8->nSize;
  if (iVar7 < 1) {
    __assert_fail("p->nSize > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                  ,0x2cc,"void *Vec_PtrPop(Vec_Ptr_t *)");
  }
  ppvVar9 = pVVar8->pArray;
  uVar1 = iVar7 - 1;
  pVVar8->nSize = uVar1;
  if (iVar7 == 1) {
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                  ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
  }
  pvVar3 = ppvVar9[uVar1];
  pvVar4 = *ppvVar9;
  uVar2 = pVVar8->nCap;
  if (uVar1 == uVar2) {
    if ((int)uVar2 < 0x10) {
      ppvVar9 = (void **)realloc(ppvVar9,0x80);
      iVar7 = 0x10;
    }
    else {
      iVar7 = uVar2 * 2;
      if (iVar7 <= (int)uVar2) goto LAB_0049181f;
      ppvVar9 = (void **)realloc(ppvVar9,(ulong)uVar2 << 4);
    }
    pVVar8->pArray = ppvVar9;
    pVVar8->nCap = iVar7;
  }
LAB_0049181f:
  iVar7 = pVVar8->nSize;
  pVVar8->nSize = iVar7 + 1;
  pVVar8->pArray[iVar7] = pvVar4;
  if (-1 < (long)iVar7) {
    *pVVar8->pArray = pvVar3;
    pAVar10 = Dch_DeriveTotalAig(pVVar8);
    if (0 < pVVar8->nSize) {
      lVar12 = 0;
      do {
        Aig_ManStop((Aig_Man_t *)pVVar8->pArray[lVar12]);
        lVar12 = lVar12 + 1;
      } while (lVar12 < pVVar8->nSize);
    }
    if (pVVar8->pArray != (void **)0x0) {
      free(pVVar8->pArray);
      pVVar8->pArray = (void **)0x0;
    }
    free(pVVar8);
    p = Dch_ComputeChoices(pAVar10,pPars);
    Aig_ManStop(pAVar10);
    pcVar5 = pAig->pName;
    pvVar3 = pAig->pManTime;
    pAig->pManTime = (void *)0x0;
    if (pcVar5 == (char *)0x0) {
      __dest = (char *)0x0;
    }
    else {
      sVar11 = strlen(pcVar5);
      __dest = (char *)malloc(sVar11 + 1);
      strcpy(__dest,pcVar5);
    }
    pcVar5 = pAig->pSpec;
    if (pcVar5 == (char *)0x0) {
      __dest_00 = (char *)0x0;
    }
    else {
      sVar11 = strlen(pcVar5);
      __dest_00 = (char *)malloc(sVar11 + 1);
      strcpy(__dest_00,pcVar5);
    }
    pVVar8 = Aig_ManOrderPios(p,pAig);
    Aig_ManStop(pAig);
    pAVar10 = Aig_ManDupDfsGuided(p,pVVar8);
    Aig_ManStop(p);
    if (pVVar8->pArray != (void **)0x0) {
      free(pVVar8->pArray);
      pVVar8->pArray = (void **)0x0;
    }
    if (pVVar8 != (Vec_Ptr_t *)0x0) {
      free(pVVar8);
    }
    pAVar10->pManTime = pvVar3;
    Aig_ManChoiceLevel(pAVar10);
    if (pAVar10->pName != (char *)0x0) {
      free(pAVar10->pName);
      pAVar10->pName = (char *)0x0;
    }
    if (pAVar10->pSpec != (char *)0x0) {
      free(pAVar10->pSpec);
      pAVar10->pSpec = (char *)0x0;
    }
    pAVar10->pName = __dest;
    pAVar10->pSpec = __dest_00;
    return pAVar10;
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                ,0x1a6,"void Vec_PtrWriteEntry(Vec_Ptr_t *, int, void *)");
}

Assistant:

Aig_Man_t * Dar_ManChoiceNewAig( Aig_Man_t * pAig, Dch_Pars_t * pPars )
{
//    extern Aig_Man_t * Dch_DeriveTotalAig( Vec_Ptr_t * vAigs );
    extern Aig_Man_t * Dch_ComputeChoices( Aig_Man_t * pAig, Dch_Pars_t * pPars );
    int fVerbose = pPars->fVerbose;
    Aig_Man_t * pMan, * pTemp;
    Vec_Ptr_t * vAigs;
    Vec_Ptr_t * vPios;
    void * pManTime;
    char * pName, * pSpec;
    int i;
    abctime clk;

clk = Abc_Clock();
    vAigs = Dar_ManChoiceSynthesis( pAig, 1, 1, pPars->fPower, fVerbose );
pPars->timeSynth = Abc_Clock() - clk;
    // swap the first and last network
    // this should lead to the primary choice being "better" because of synthesis
    // (it is also important when constructing choices)
    pMan = (Aig_Man_t *)Vec_PtrPop( vAigs );
    Vec_PtrPush( vAigs, Vec_PtrEntry(vAigs,0) );
    Vec_PtrWriteEntry( vAigs, 0, pMan );

    // derive the total AIG
    pMan = Dch_DeriveTotalAig( vAigs );
    // cleanup
    Vec_PtrForEachEntry( Aig_Man_t *, vAigs, pTemp, i )
        Aig_ManStop( pTemp );
    Vec_PtrFree( vAigs );

    // compute choices
    pMan = Dch_ComputeChoices( pTemp = pMan, pPars );
    Aig_ManStop( pTemp );

    // save useful things
    pManTime = pAig->pManTime; pAig->pManTime = NULL;
    pName = Abc_UtilStrsav( pAig->pName );
    pSpec = Abc_UtilStrsav( pAig->pSpec );

    // create guidence
    vPios = Aig_ManOrderPios( pMan, pAig ); 
    Aig_ManStop( pAig );

    // reconstruct the network
    pMan = Aig_ManDupDfsGuided( pTemp = pMan, vPios );
    Aig_ManStop( pTemp );
    Vec_PtrFree( vPios );

    // reset levels
    pMan->pManTime = pManTime;
    Aig_ManChoiceLevel( pMan );

    // copy names
    ABC_FREE( pMan->pName );
    ABC_FREE( pMan->pSpec );
    pMan->pName = pName;
    pMan->pSpec = pSpec;
    return pMan;
}